

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assignment.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  FilterType filter2;
  array<double,_5UL> res2;
  array<double,_5UL> res1;
  FilterType filter;
  HighPass<8,_Iir::DirectFormII> *in_stack_fffffffffffff4c8;
  undefined4 in_stack_fffffffffffff4d0;
  int in_stack_fffffffffffff4d4;
  array<double,_5UL> *in_stack_fffffffffffff4e8;
  FilterType *in_stack_fffffffffffff4f0;
  undefined1 local_b08 [40];
  undefined1 local_ae0 [40];
  undefined1 local_ab8 [40];
  undefined1 local_a90 [40];
  undefined1 local_a68 [856];
  undefined1 local_710 [40];
  undefined1 local_6e8 [856];
  undefined1 local_390 [40];
  undefined1 local_368 [868];
  undefined4 local_4;
  
  local_4 = 0;
  std::operator<<((ostream *)&std::cout,"Creating and testing filter using automatic decl\n");
  Iir::Butterworth::HighPass<8,_Iir::DirectFormII>::HighPass
            ((HighPass<8,_Iir::DirectFormII> *)0x1025e1);
  Iir::Butterworth::HighPass<8,_Iir::DirectFormII>::setupN
            ((HighPass<8,_Iir::DirectFormII> *)
             CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
             (double)in_stack_fffffffffffff4c8);
  testFilter(in_stack_fffffffffffff4f0);
  std::operator<<((ostream *)&std::cout,"Creating and testing filter using object assignment\n");
  memset(local_6e8,0,0x358);
  Iir::Butterworth::HighPass<8,_Iir::DirectFormII>::HighPass
            ((HighPass<8,_Iir::DirectFormII> *)0x10263f);
  Iir::Butterworth::HighPass<8,_Iir::DirectFormII>::operator=
            ((HighPass<8,_Iir::DirectFormII> *)
             CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),in_stack_fffffffffffff4c8
            );
  Iir::Butterworth::HighPass<8,_Iir::DirectFormII>::setupN
            ((HighPass<8,_Iir::DirectFormII> *)
             CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
             (double)in_stack_fffffffffffff4c8);
  testFilter(in_stack_fffffffffffff4f0);
  sq_err((array<double,_5UL> *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  assert_print(in_stack_fffffffffffff4d4,(char *)in_stack_fffffffffffff4c8);
  memcpy(local_a68,local_368,0x358);
  std::operator<<((ostream *)&std::cout,"Calculating continued response using original filter:\n");
  testFilter(in_stack_fffffffffffff4f0);
  memcpy(local_390,local_a90,0x28);
  std::operator<<((ostream *)&std::cout,"Calculating continued response using assigned filter:\n");
  testFilter(in_stack_fffffffffffff4f0);
  memcpy(local_710,local_ab8,0x28);
  memcpy(local_ae0,&DAT_00109248,0x28);
  sq_err((array<double,_5UL> *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  assert_print(in_stack_fffffffffffff4d4,(char *)in_stack_fffffffffffff4c8);
  sq_err((array<double,_5UL> *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  assert_print(in_stack_fffffffffffff4d4,(char *)in_stack_fffffffffffff4c8);
  std::operator<<((ostream *)&std::cout,
                  "Checking continued responses differ when second filter changes cutoff:\n");
  Iir::Butterworth::HighPass<8,_Iir::DirectFormII>::setupN
            ((HighPass<8,_Iir::DirectFormII> *)
             CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
             (double)in_stack_fffffffffffff4c8);
  testFilter(in_stack_fffffffffffff4f0);
  memcpy(local_390,local_b08,0x28);
  testFilter(in_stack_fffffffffffff4f0);
  memcpy(local_710,&stack0xfffffffffffff4d0,0x28);
  sq_err((array<double,_5UL> *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  assert_print(in_stack_fffffffffffff4d4,(char *)in_stack_fffffffffffff4c8);
  return 0;
}

Assistant:

int main(int, char**) {
    // setup & test 1st time
    std::cout << "Creating and testing filter using automatic decl\n";
    FilterType filter;
    filter.setupN(0.1);
    std::array<double, test_len> res1 { testFilter(filter) }; 
    // Test response: [0.192873, -0.427308, -0.00869136, 0.266734, 0.2204]

    // setup & test 2nd time
    std::cout << "Creating and testing filter using object assignment\n";
    filter = FilterType();  // this assignment seems to be the problem
    filter.setupN(0.1);
    std::array<double, test_len> res2 { testFilter(filter) }; 
    assert_print(sq_err(res1, res2) < 1e-10,
                 "Filter produces different results after initialisation by assignment.\n");
    
    // Copy into new filter and check same result from each.
    FilterType filter2 = filter;
    std::cout << "Calculating continued response using original filter:\n";
    res1 = testFilter(filter);
    std::cout << "Calculating continued response using assigned filter:\n";
    res2 = testFilter(filter2);
    assert_print(sq_err(res1, std::array<double, test_len> {
                          0.0189142, -0.150791, -0.197797, -0.129944, -0.00990682
                        }) < 1e-10,
                 "Incorrect result from original filter.\n");
    assert_print(sq_err(res1, res2) < 1e-10,
                 "Filter iterates inconsistently after copy.\n");
    
    std::cout << "Checking continued responses differ when second filter changes cutoff:\n";
    filter2.setupN(0.3);
    res1 = testFilter(filter);
    res2 = testFilter(filter2);
    assert_print(sq_err(res1, res2) > 1e-3,
                 "Altering assigned filter cutoff also changes original filter.\n");
    
    
    return 0;
}